

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O1

void __thiscall xmrig::Url::Url(Url *this,char *host,uint16_t port,bool tls,Scheme scheme)

{
  ulong __n;
  size_t sVar1;
  char *__s;
  
  this->m_tls = tls;
  this->m_scheme = scheme;
  String::String(&this->m_host,host);
  (this->m_url).m_data = (char *)0x0;
  (this->m_url).m_size = 0;
  this->m_port = port;
  sVar1 = (this->m_host).m_size;
  __n = sVar1 + 8;
  __s = (char *)operator_new__(__n);
  memset(__s,0,__n);
  snprintf(__s,sVar1 + 7,"%s:%d",(this->m_host).m_data,(ulong)port);
  String::move(&this->m_url,__s);
  return;
}

Assistant:

xmrig::Url::Url(const char *host, uint16_t port, bool tls, Scheme scheme) :
    m_tls(tls),
    m_scheme(scheme),
    m_host(host),
    m_port(port)
{
    const size_t size = m_host.size() + 8;
    assert(size > 8);

    char *url = new char[size]();
    snprintf(url, size - 1, "%s:%d", m_host.data(), m_port);

    m_url = url;
}